

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_buffer.cpp
# Opt level: O2

void addTests_Image_Buffer(UnitTestFramework *framework)

{
  allocator local_12d;
  allocator local_12c;
  allocator local_12b;
  allocator local_12a;
  allocator local_129;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string
            ((string *)&local_128,"template_image::EmptyConstructor",(allocator *)&local_108);
  UnitTestFramework::add(framework,template_image::EmptyConstructor,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string
            ((string *)&local_128,"template_image::Constructor",(allocator *)&local_108);
  UnitTestFramework::add(framework,template_image::Constructor,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string
            ((string *)&local_128,"template_image::NullAssignment",(allocator *)&local_108);
  UnitTestFramework::add(framework,template_image::NullAssignment,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"uint8_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_char>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"uint16_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_short>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"uint32_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_int>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"uint64_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<unsigned_long>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"int8_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<signed_char>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"int16_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<short>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"int32_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<int>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"int64_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<long>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"float",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<float>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"CopyConstructor",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"double",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_CopyConstructor<double>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"uint8_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_char>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"uint16_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_short>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"uint32_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_int>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"uint64_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<unsigned_long>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"int8_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<signed_char>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"int16_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<short>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"int32_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<int>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"int64_t",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<long>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"float",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<float>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string((string *)&local_68,"template_image::",&local_129);
  std::__cxx11::string::string((string *)&local_88,"AssignmentOperator",&local_12a);
  std::operator+(&local_48,&local_68,&local_88);
  std::__cxx11::string::string((string *)&local_a8," (",&local_12b);
  std::operator+(&local_28,&local_48,&local_a8);
  std::__cxx11::string::string((string *)&local_c8,"double",&local_12c);
  std::operator+(&local_108,&local_28,&local_c8);
  std::__cxx11::string::string((string *)&local_e8,")",&local_12d);
  std::operator+(&local_128,&local_108,&local_e8);
  UnitTestFramework::add(framework,template_image::_AssignmentOperator<double>,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void addTests_Image_Buffer( UnitTestFramework & framework )
{
    ADD_TEST( framework, template_image::EmptyConstructor );
    ADD_TEST( framework, template_image::Constructor );
    ADD_TEST( framework, template_image::NullAssignment );

    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint8_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint16_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint32_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, uint64_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int8_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int16_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int32_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, int64_t );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, float );
    ADD_TEMPLATE_FUNCTION( CopyConstructor, double );

    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint8_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint16_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint32_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, uint64_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int8_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int16_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int32_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, int64_t );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, float );
    ADD_TEMPLATE_FUNCTION( AssignmentOperator, double );
}